

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O3

void __thiscall
duckdb::MetaTransaction::RemoveTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  __node_base_ptr p_Var1;
  reference pvVar2;
  InternalException *this_00;
  __hash_code __code;
  size_type __n;
  undefined1 local_48 [32];
  
  local_48._0_8_ = db;
  p_Var1 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->transactions)._M_h,
                      (ulong)db % (this->transactions)._M_h._M_bucket_count,(key_type *)local_48,
                      (__hash_code)db);
  if ((p_Var1 != (__node_base_ptr)0x0) && ((__node_type *)p_Var1->_M_nxt != (__node_type *)0x0)) {
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(&(this->transactions)._M_h,(const_iterator)p_Var1->_M_nxt);
    if ((this->all_transactions).
        super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->all_transactions).
        super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar2 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::operator[]
                           (&this->all_transactions,__n);
        if (pvVar2->_M_data == db) {
          vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::erase_at
                    (&this->all_transactions,__n);
          return;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->all_transactions).
                                   super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                                   .
                                   super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->all_transactions).
                                   super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                                   .
                                   super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "MetaTransaction::RemoveTransaction called but meta transaction did not have a transaction for this database"
             ,"");
  InternalException::InternalException(this_00,(string *)local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MetaTransaction::RemoveTransaction(AttachedDatabase &db) {
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		throw InternalException("MetaTransaction::RemoveTransaction called but meta transaction did not have a "
		                        "transaction for this database");
	}
	transactions.erase(entry);
	for (idx_t i = 0; i < all_transactions.size(); i++) {
		auto &db_entry = all_transactions[i];
		if (RefersToSameObject(db_entry.get(), db)) {
			all_transactions.erase_at(i);
			break;
		}
	}
}